

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Relations dg::vr::Relations::conflicting(Type type)

{
  Relations *pRVar1;
  undefined4 in_EDI;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  _Base_bitset<1UL> local_8;
  
  switch(in_EDI) {
  case 0:
    memset(local_18,0,8);
    Relations((Relations *)0x102649);
    ne((Relations *)0x102653);
    slt((Relations *)0x10265b);
    ult((Relations *)0x102663);
    sgt((Relations *)0x10266b);
    pRVar1 = ugt((Relations *)0x102673);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 1:
    memset(local_20,0,8);
    Relations((Relations *)0x10269b);
    pRVar1 = eq((Relations *)0x1026a5);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 2:
    memset(local_48,0,8);
    Relations((Relations *)0x1027d5);
    pRVar1 = sgt((Relations *)0x1027df);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 3:
    memset(local_28,0,8);
    Relations((Relations *)0x1026cd);
    eq((Relations *)0x1026d7);
    sgt((Relations *)0x1026df);
    pRVar1 = sge((Relations *)0x1026e7);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 4:
    memset(local_50,0,8);
    Relations((Relations *)0x102807);
    pRVar1 = ugt((Relations *)0x102811);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 5:
    memset(local_30,0,8);
    Relations((Relations *)0x10270f);
    eq((Relations *)0x102719);
    ugt((Relations *)0x102721);
    pRVar1 = uge((Relations *)0x102729);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 6:
    memset(local_58,0,8);
    Relations((Relations *)0x102839);
    pRVar1 = slt((Relations *)0x102843);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 7:
    memset(local_38,0,8);
    Relations((Relations *)0x102751);
    eq((Relations *)0x10275b);
    slt((Relations *)0x102763);
    pRVar1 = sle((Relations *)0x10276b);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 8:
    memset(local_60,0,8);
    Relations((Relations *)0x102868);
    pRVar1 = ult((Relations *)0x102872);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 9:
    memset(local_40,0,8);
    Relations((Relations *)0x102793);
    eq((Relations *)0x10279d);
    ult((Relations *)0x1027a5);
    pRVar1 = ule((Relations *)0x1027ad);
    local_8._M_w = (pRVar1->bits).super__Base_bitset<1UL>._M_w;
    break;
  case 10:
  case 0xb:
    memset(&local_8,0,8);
    Relations((Relations *)0x102897);
    break;
  default:
    abort();
  }
  return (Relations)local_8._M_w;
}

Assistant:

Relations Relations::conflicting(Relations::Type type) {
    switch (type) {
    case EQ:
        return Relations().ne().slt().ult().sgt().ugt();
    case NE:
        return Relations().eq();
    case SLT:
        return Relations().eq().sgt().sge();
    case ULT:
        return Relations().eq().ugt().uge();
    case SGT:
        return Relations().eq().slt().sle();
    case UGT:
        return Relations().eq().ult().ule();
    case SLE:
        return Relations().sgt();
    case ULE:
        return Relations().ugt();
    case SGE:
        return Relations().slt();
    case UGE:
        return Relations().ult();
    case PT:
    case PF:
        return {};
    }
    assert(0 && "unreachable");
    abort();
}